

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::TransformerLinLog>::operator()
          (LineStripRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<unsigned_int> *pGVar8;
  TransformerLinLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  ImPlotContext *pIVar17;
  int iVar18;
  ImDrawIdx IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  pIVar17 = GImPlot;
  pGVar8 = this->Getter;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  dVar1 = pGVar8->XScale;
  dVar2 = pGVar8->X0;
  dVar14 = log10((double)*(uint *)((long)pGVar8->Ys +
                                  (long)(((prim + 1 + pGVar8->Offset) % iVar18 + iVar18) % iVar18) *
                                  (long)pGVar8->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar18 = pTVar9->YAxis;
  pIVar10 = pIVar17->CurrentPlot;
  dVar3 = pIVar10->YAxis[iVar18].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar20 = (float)(pIVar17->Mx * ((dVar2 + (double)(prim + 1) * dVar1) - (pIVar10->XAxis).Range.Min)
                  + (double)IVar4.x);
  fVar21 = (float)(pIVar17->My[iVar18] *
                   ((dVar3 + (double)(float)(dVar14 / pIVar17->LogDenY[iVar18]) *
                             (pIVar10->YAxis[iVar18].Range.Max - dVar3)) - dVar3) + (double)IVar4.y)
  ;
  fVar22 = (this->P1).x;
  fVar23 = (this->P1).y;
  auVar27._0_4_ = ~-(uint)(fVar20 <= fVar22) & (uint)fVar20;
  auVar27._4_4_ = ~-(uint)(fVar21 <= fVar23) & (uint)fVar21;
  auVar27._8_4_ = ~-(uint)(fVar22 < fVar20) & (uint)fVar20;
  auVar27._12_4_ = ~-(uint)(fVar23 < fVar21) & (uint)fVar21;
  auVar15._4_4_ = (uint)fVar23 & -(uint)(fVar21 <= fVar23);
  auVar15._0_4_ = (uint)fVar22 & -(uint)(fVar20 <= fVar22);
  auVar15._8_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar20);
  auVar15._12_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar21);
  auVar27 = auVar27 | auVar15;
  fVar24 = (cull_rect->Min).y;
  auVar16._4_8_ = auVar27._8_8_;
  auVar16._0_4_ = -(uint)(auVar27._4_4_ < fVar24);
  auVar28._0_8_ = auVar16._0_8_ << 0x20;
  auVar28._8_4_ = -(uint)(auVar27._8_4_ < (cull_rect->Max).x);
  auVar28._12_4_ = -(uint)(auVar27._12_4_ < (cull_rect->Max).y);
  auVar29._4_4_ = -(uint)(fVar24 < auVar27._4_4_);
  auVar29._0_4_ = -(uint)((cull_rect->Min).x < auVar27._0_4_);
  auVar29._8_8_ = auVar28._8_8_;
  iVar18 = movmskps((int)pIVar10,auVar29);
  if (iVar18 == 0xf) {
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar24 = fVar20 - fVar22;
    fVar25 = fVar21 - fVar23;
    fVar26 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar26) {
      fVar26 = 1.0 / SQRT(fVar26);
      fVar24 = fVar24 * fVar26;
      fVar25 = fVar25 * fVar26;
    }
    fVar26 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    fVar24 = fVar26 * fVar24;
    fVar26 = fVar26 * fVar25;
    (pIVar11->pos).x = fVar22 + fVar26;
    (pIVar11->pos).y = fVar23 - fVar24;
    pIVar12[1].pos.x = fVar26 + fVar20;
    pIVar12[1].pos.y = fVar21 - fVar24;
    pIVar12[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar20 - fVar26;
    pIVar11[2].pos.y = fVar24 + fVar21;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    IVar5 = this->P1;
    pIVar11[3].pos.x = IVar5.x - fVar26;
    pIVar11[3].pos.y = IVar5.y + fVar24;
    pIVar11[3].uv.x = IVar4.x;
    pIVar11[3].uv.y = IVar4.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar7;
    *pIVar13 = IVar19;
    pIVar13[1] = IVar19 + 1;
    pIVar13[2] = IVar19 + 2;
    pIVar13[3] = IVar19;
    pIVar13[4] = IVar19 + 2;
    pIVar13[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  IVar4.y = fVar21;
  IVar4.x = fVar20;
  this->P1 = IVar4;
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }